

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O1

spvc_result
spvc_compiler_options_set_uint(spvc_compiler_options options,spvc_compiler_option option,uint value)

{
  spvc_context psVar1;
  spvc_result sVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  if ((~options->backend_flags & option & 0xf000000) == SPVC_COMPILER_OPTION_UNKNOWN) {
    if ((int)option < 0x400005a) {
      if ((int)option < 0x2000021) {
        if ((int)option < 0x1000036) {
          switch(option) {
          case SPVC_COMPILER_OPTION_FORCE_TEMPORARY:
            (options->glsl).force_temporary = value != 0;
            break;
          case SPVC_COMPILER_OPTION_FLATTEN_MULTIDIMENSIONAL_ARRAYS:
            (options->glsl).flatten_multidimensional_arrays = value != 0;
            break;
          case SPVC_COMPILER_OPTION_FIXUP_DEPTH_CONVENTION:
            (options->glsl).vertex.fixup_clipspace = value != 0;
            break;
          case SPVC_COMPILER_OPTION_FLIP_VERTEX_Y:
            (options->glsl).vertex.flip_vert_y = value != 0;
            break;
          default:
            if (option == SPVC_COMPILER_OPTION_EMIT_LINE_DIRECTIVES) {
              (options->glsl).emit_line_directives = value != 0;
            }
            else {
              if (option != SPVC_COMPILER_OPTION_ENABLE_STORAGE_IMAGE_QUALIFIER_DEDUCTION)
              goto switchD_00150205_caseD_8000021;
              (options->glsl).enable_storage_image_qualifier_deduction = value != 0;
            }
          }
        }
        else {
          switch(option) {
          case SPVC_COMPILER_OPTION_GLSL_SUPPORT_NONZERO_BASE_INSTANCE:
            (options->glsl).vertex.support_nonzero_base_instance = value != 0;
            break;
          case SPVC_COMPILER_OPTION_GLSL_SEPARATE_SHADER_OBJECTS:
            (options->glsl).separate_shader_objects = value != 0;
            break;
          case SPVC_COMPILER_OPTION_GLSL_ENABLE_420PACK_EXTENSION:
            (options->glsl).enable_420pack_extension = value != 0;
            break;
          case SPVC_COMPILER_OPTION_GLSL_VERSION:
            (options->glsl).version = value;
            break;
          case SPVC_COMPILER_OPTION_GLSL_ES:
            (options->glsl).es = value != 0;
            break;
          case SPVC_COMPILER_OPTION_GLSL_VULKAN_SEMANTICS:
            (options->glsl).vulkan_semantics = value != 0;
            break;
          case SPVC_COMPILER_OPTION_GLSL_ES_DEFAULT_FLOAT_PRECISION_HIGHP:
            (options->glsl).fragment.default_float_precision = Highp - (value == 0);
            break;
          case SPVC_COMPILER_OPTION_GLSL_ES_DEFAULT_INT_PRECISION_HIGHP:
            (options->glsl).fragment.default_int_precision = Highp - (value == 0);
            break;
          default:
            if (option == SPVC_COMPILER_OPTION_FORCE_ZERO_INITIALIZED_VARIABLES) {
              (options->glsl).force_zero_initialized_variables = value != 0;
            }
            else {
              if (option != SPVC_COMPILER_OPTION_RELAX_NAN_CHECKS)
              goto switchD_00150205_caseD_8000021;
              (options->glsl).relax_nan_checks = value != 0;
            }
          }
        }
      }
      else if ((int)option < 0x400000d) {
        if ((int)option < 0x2000042) {
          if (option == SPVC_COMPILER_OPTION_GLSL_EMIT_PUSH_CONSTANT_AS_UNIFORM_BUFFER) {
            (options->glsl).emit_push_constant_as_uniform_buffer = value != 0;
          }
          else {
            if (option != SPVC_COMPILER_OPTION_GLSL_EMIT_UNIFORM_BUFFER_AS_PLAIN_UNIFORMS)
            goto switchD_00150205_caseD_8000021;
            (options->glsl).emit_uniform_buffer_as_plain_uniforms = value != 0;
          }
        }
        else if (option == SPVC_COMPILER_OPTION_GLSL_FORCE_FLATTENED_IO_BLOCKS) {
          (options->glsl).force_flattened_io_blocks = value != 0;
        }
        else if (option == SPVC_COMPILER_OPTION_GLSL_OVR_MULTIVIEW_VIEW_COUNT) {
          (options->glsl).ovr_multiview_view_count = value;
        }
        else {
          if (option != SPVC_COMPILER_OPTION_GLSL_ENABLE_ROW_MAJOR_LOAD_WORKAROUND)
          goto switchD_00150205_caseD_8000021;
          (options->glsl).enable_row_major_load_workaround = value != 0;
        }
      }
      else if ((int)option < 0x4000035) {
        switch(option) {
        case SPVC_COMPILER_OPTION_HLSL_SHADER_MODEL:
          (options->hlsl).shader_model = value;
          break;
        case SPVC_COMPILER_OPTION_HLSL_POINT_SIZE_COMPAT:
          (options->hlsl).point_size_compat = value != 0;
          break;
        case SPVC_COMPILER_OPTION_HLSL_POINT_COORD_COMPAT:
          (options->hlsl).point_coord_compat = value != 0;
          break;
        case SPVC_COMPILER_OPTION_HLSL_SUPPORT_NONZERO_BASE_VERTEX_BASE_INSTANCE:
          (options->hlsl).support_nonzero_base_vertex_base_instance = value != 0;
          break;
        default:
          goto switchD_00150205_caseD_8000021;
        }
      }
      else if ((int)option < 0x400003c) {
        if (option == SPVC_COMPILER_OPTION_HLSL_FORCE_STORAGE_BUFFER_AS_UAV) {
          (options->hlsl).force_storage_buffer_as_uav = value != 0;
        }
        else {
          if (option != SPVC_COMPILER_OPTION_HLSL_NONWRITABLE_UAV_TEXTURE_AS_SRV)
          goto switchD_00150205_caseD_8000021;
          (options->hlsl).nonwritable_uav_texture_as_srv = value != 0;
        }
      }
      else if (option == SPVC_COMPILER_OPTION_HLSL_ENABLE_16BIT_TYPES) {
        (options->hlsl).enable_16bit_types = value != 0;
      }
      else {
        if (option != SPVC_COMPILER_OPTION_HLSL_FLATTEN_MATRIX_VERTEX_INPUT_SEMANTICS)
        goto switchD_00150205_caseD_8000021;
        (options->hlsl).flatten_matrix_vertex_input_semantics = value != 0;
      }
    }
    else {
      switch(option) {
      case SPVC_COMPILER_OPTION_MSL_VERSION:
        (options->msl).msl_version = value;
        break;
      case SPVC_COMPILER_OPTION_MSL_TEXEL_BUFFER_TEXTURE_WIDTH:
        (options->msl).texel_buffer_texture_width = value;
        break;
      case SPVC_COMPILER_OPTION_MSL_AUX_BUFFER_INDEX:
        (options->msl).swizzle_buffer_index = value;
        break;
      case SPVC_COMPILER_OPTION_MSL_INDIRECT_PARAMS_BUFFER_INDEX:
        (options->msl).indirect_params_buffer_index = value;
        break;
      case SPVC_COMPILER_OPTION_MSL_SHADER_OUTPUT_BUFFER_INDEX:
        (options->msl).shader_output_buffer_index = value;
        break;
      case SPVC_COMPILER_OPTION_MSL_SHADER_PATCH_OUTPUT_BUFFER_INDEX:
        (options->msl).shader_patch_output_buffer_index = value;
        break;
      case SPVC_COMPILER_OPTION_MSL_SHADER_TESS_FACTOR_OUTPUT_BUFFER_INDEX:
        (options->msl).shader_tess_factor_buffer_index = value;
        break;
      case SPVC_COMPILER_OPTION_MSL_SHADER_INPUT_WORKGROUP_INDEX:
        (options->msl).shader_input_wg_index = value;
        break;
      case SPVC_COMPILER_OPTION_MSL_ENABLE_POINT_SIZE_BUILTIN:
        (options->msl).enable_point_size_builtin = value != 0;
        break;
      case SPVC_COMPILER_OPTION_MSL_DISABLE_RASTERIZATION:
        (options->msl).disable_rasterization = value != 0;
        break;
      case SPVC_COMPILER_OPTION_MSL_CAPTURE_OUTPUT_TO_BUFFER:
        (options->msl).capture_output_to_buffer = value != 0;
        break;
      case SPVC_COMPILER_OPTION_MSL_SWIZZLE_TEXTURE_SAMPLES:
        (options->msl).swizzle_texture_samples = value != 0;
        break;
      case SPVC_COMPILER_OPTION_MSL_PAD_FRAGMENT_OUTPUT_COMPONENTS:
        (options->msl).pad_fragment_output_components = value != 0;
        break;
      case SPVC_COMPILER_OPTION_MSL_TESS_DOMAIN_ORIGIN_LOWER_LEFT:
        (options->msl).tess_domain_origin_lower_left = value != 0;
        break;
      case SPVC_COMPILER_OPTION_MSL_PLATFORM:
        (options->msl).platform = value;
        break;
      case SPVC_COMPILER_OPTION_MSL_ARGUMENT_BUFFERS:
        (options->msl).argument_buffers = value != 0;
        break;
      case 0x8000021:
      case 0x8000023:
      case 0x8000025:
      case 0x8000034:
      case 0x8000035:
      case 0x8000036:
      case 0x8000037:
      case 0x800003c:
      case 0x8000042:
      case 0x8000047:
      case 0x800004d:
      case 0x800004e:
      case 0x8000053:
switchD_00150205_caseD_8000021:
        psVar1 = options->context;
        puVar4 = local_48;
        local_58[0] = puVar4;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Unknown option.","");
        std::__cxx11::string::operator=((string *)psVar1,(string *)local_58);
        puVar3 = local_58[0];
        if (psVar1->callback != (spvc_error_callback)0x0) {
          (*psVar1->callback)(psVar1->callback_userdata,(psVar1->last_error)._M_dataplus._M_p);
          puVar3 = local_58[0];
        }
        goto LAB_0015025c;
      case SPVC_COMPILER_OPTION_MSL_TEXTURE_BUFFER_NATIVE:
        (options->msl).texture_buffer_native = value != 0;
        break;
      case SPVC_COMPILER_OPTION_MSL_BUFFER_SIZE_BUFFER_INDEX:
        (options->msl).buffer_size_buffer_index = value;
        break;
      case SPVC_COMPILER_OPTION_MSL_MULTIVIEW:
        (options->msl).multiview = value != 0;
        break;
      case SPVC_COMPILER_OPTION_MSL_VIEW_MASK_BUFFER_INDEX:
        (options->msl).view_mask_buffer_index = value;
        break;
      case SPVC_COMPILER_OPTION_MSL_DEVICE_INDEX:
        (options->msl).device_index = value;
        break;
      case SPVC_COMPILER_OPTION_MSL_VIEW_INDEX_FROM_DEVICE_INDEX:
        (options->msl).view_index_from_device_index = value != 0;
        break;
      case SPVC_COMPILER_OPTION_MSL_DISPATCH_BASE:
        (options->msl).dispatch_base = value != 0;
        break;
      case SPVC_COMPILER_OPTION_MSL_DYNAMIC_OFFSETS_BUFFER_INDEX:
        (options->msl).dynamic_offsets_buffer_index = value;
        break;
      case SPVC_COMPILER_OPTION_MSL_TEXTURE_1D_AS_2D:
        (options->msl).texture_1D_as_2D = value != 0;
        break;
      case SPVC_COMPILER_OPTION_MSL_ENABLE_BASE_INDEX_ZERO:
        (options->msl).enable_base_index_zero = value != 0;
        break;
      case SPVC_COMPILER_OPTION_MSL_FRAMEBUFFER_FETCH_SUBPASS:
        (options->msl).use_framebuffer_fetch_subpasses = value != 0;
        break;
      case SPVC_COMPILER_OPTION_MSL_INVARIANT_FP_MATH:
        (options->msl).invariant_float_math = value != 0;
        break;
      case SPVC_COMPILER_OPTION_MSL_EMULATE_CUBEMAP_ARRAY:
        (options->msl).emulate_cube_array = value != 0;
        break;
      case SPVC_COMPILER_OPTION_MSL_ENABLE_DECORATION_BINDING:
        (options->msl).enable_decoration_binding = value != 0;
        break;
      case SPVC_COMPILER_OPTION_MSL_FORCE_ACTIVE_ARGUMENT_BUFFER_RESOURCES:
        (options->msl).force_active_argument_buffer_resources = value != 0;
        break;
      case SPVC_COMPILER_OPTION_MSL_FORCE_NATIVE_ARRAYS:
        (options->msl).force_native_arrays = value != 0;
        break;
      case SPVC_COMPILER_OPTION_MSL_ENABLE_FRAG_OUTPUT_MASK:
        (options->msl).enable_frag_output_mask = value;
        break;
      case SPVC_COMPILER_OPTION_MSL_ENABLE_FRAG_DEPTH_BUILTIN:
        (options->msl).enable_frag_depth_builtin = value != 0;
        break;
      case SPVC_COMPILER_OPTION_MSL_ENABLE_FRAG_STENCIL_REF_BUILTIN:
        (options->msl).enable_frag_stencil_ref_builtin = value != 0;
        break;
      case SPVC_COMPILER_OPTION_MSL_ENABLE_CLIP_DISTANCE_USER_VARYING:
        (options->msl).enable_clip_distance_user_varying = value != 0;
        break;
      case SPVC_COMPILER_OPTION_MSL_MULTI_PATCH_WORKGROUP:
        (options->msl).multi_patch_workgroup = value != 0;
        break;
      case SPVC_COMPILER_OPTION_MSL_SHADER_INPUT_BUFFER_INDEX:
        (options->msl).shader_input_buffer_index = value;
        break;
      case SPVC_COMPILER_OPTION_MSL_SHADER_INDEX_BUFFER_INDEX:
        (options->msl).shader_index_buffer_index = value;
        break;
      case SPVC_COMPILER_OPTION_MSL_VERTEX_FOR_TESSELLATION:
        (options->msl).vertex_for_tessellation = value != 0;
        break;
      case SPVC_COMPILER_OPTION_MSL_VERTEX_INDEX_TYPE:
        (options->msl).vertex_index_type = value;
        break;
      case SPVC_COMPILER_OPTION_MSL_MULTIVIEW_LAYERED_RENDERING:
        (options->msl).multiview_layered_rendering = value != 0;
        break;
      case SPVC_COMPILER_OPTION_MSL_ARRAYED_SUBPASS_INPUT:
        (options->msl).arrayed_subpass_input = value != 0;
        break;
      case SPVC_COMPILER_OPTION_MSL_R32UI_LINEAR_TEXTURE_ALIGNMENT:
        (options->msl).r32ui_linear_texture_alignment = value;
        break;
      case SPVC_COMPILER_OPTION_MSL_R32UI_ALIGNMENT_CONSTANT_ID:
        (options->msl).r32ui_alignment_constant_id = value;
        break;
      case SPVC_COMPILER_OPTION_MSL_IOS_USE_SIMDGROUP_FUNCTIONS:
        (options->msl).ios_use_simdgroup_functions = value != 0;
        break;
      case SPVC_COMPILER_OPTION_MSL_EMULATE_SUBGROUPS:
        (options->msl).emulate_subgroups = value != 0;
        break;
      case SPVC_COMPILER_OPTION_MSL_FIXED_SUBGROUP_SIZE:
        (options->msl).fixed_subgroup_size = value;
        break;
      case SPVC_COMPILER_OPTION_MSL_FORCE_SAMPLE_RATE_SHADING:
        (options->msl).force_sample_rate_shading = value != 0;
        break;
      case SPVC_COMPILER_OPTION_MSL_IOS_SUPPORT_BASE_VERTEX_INSTANCE:
        (options->msl).ios_support_base_vertex_instance = value != 0;
        break;
      case SPVC_COMPILER_OPTION_MSL_RAW_BUFFER_TESE_INPUT:
        (options->msl).raw_buffer_tese_input = value != 0;
        break;
      case SPVC_COMPILER_OPTION_MSL_SHADER_PATCH_INPUT_BUFFER_INDEX:
        (options->msl).shader_patch_input_buffer_index = value;
        break;
      case SPVC_COMPILER_OPTION_MSL_MANUAL_HELPER_INVOCATION_UPDATES:
        (options->msl).manual_helper_invocation_updates = value != 0;
        break;
      case SPVC_COMPILER_OPTION_MSL_CHECK_DISCARDED_FRAG_STORES:
        (options->msl).check_discarded_frag_stores = value != 0;
        break;
      case SPVC_COMPILER_OPTION_MSL_ARGUMENT_BUFFERS_TIER:
        (options->msl).argument_buffers_tier = value;
        break;
      case SPVC_COMPILER_OPTION_MSL_SAMPLE_DREF_LOD_ARRAY_AS_GRAD:
        (options->msl).sample_dref_lod_array_as_grad = value != 0;
        break;
      case SPVC_COMPILER_OPTION_MSL_READWRITE_TEXTURE_FENCES:
        (options->msl).readwrite_texture_fences = value != 0;
        break;
      case SPVC_COMPILER_OPTION_MSL_REPLACE_RECURSIVE_INPUTS:
        (options->msl).replace_recursive_inputs = value != 0;
        break;
      case SPVC_COMPILER_OPTION_MSL_AGX_MANUAL_CUBE_GRAD_FIXUP:
        (options->msl).agx_manual_cube_grad_fixup = value != 0;
        break;
      case SPVC_COMPILER_OPTION_MSL_FORCE_FRAGMENT_WITH_SIDE_EFFECTS_EXECUTION:
        (options->msl).force_fragment_with_side_effects_execution = value != 0;
        break;
      default:
        if (option == SPVC_COMPILER_OPTION_HLSL_USE_ENTRY_POINT_NAME) {
          (options->hlsl).use_entry_point_name = value != 0;
        }
        else {
          if (option != SPVC_COMPILER_OPTION_HLSL_PRESERVE_STRUCTURED_BUFFERS)
          goto switchD_00150205_caseD_8000021;
          (options->hlsl).preserve_structured_buffers = value != 0;
        }
      }
    }
    sVar2 = SPVC_SUCCESS;
  }
  else {
    psVar1 = options->context;
    puVar4 = local_28;
    local_38[0] = puVar4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_38,"Option is not supported by current backend.","");
    std::__cxx11::string::operator=((string *)psVar1,(string *)local_38);
    puVar3 = local_38[0];
    if (psVar1->callback != (spvc_error_callback)0x0) {
      (*psVar1->callback)(psVar1->callback_userdata,(psVar1->last_error)._M_dataplus._M_p);
      puVar3 = local_38[0];
    }
LAB_0015025c:
    sVar2 = SPVC_ERROR_INVALID_ARGUMENT;
    if (puVar3 != puVar4) {
      operator_delete(puVar3);
    }
  }
  return sVar2;
}

Assistant:

spvc_result spvc_compiler_options_set_uint(spvc_compiler_options options, spvc_compiler_option option, unsigned value)
{
	(void)value;
	(void)option;
	uint32_t supported_mask = options->backend_flags;
	uint32_t required_mask = option & SPVC_COMPILER_OPTION_LANG_BITS;
	if ((required_mask | supported_mask) != supported_mask)
	{
		options->context->report_error("Option is not supported by current backend.");
		return SPVC_ERROR_INVALID_ARGUMENT;
	}

	switch (option)
	{
#if SPIRV_CROSS_C_API_GLSL
	case SPVC_COMPILER_OPTION_FORCE_TEMPORARY:
		options->glsl.force_temporary = value != 0;
		break;
	case SPVC_COMPILER_OPTION_FLATTEN_MULTIDIMENSIONAL_ARRAYS:
		options->glsl.flatten_multidimensional_arrays = value != 0;
		break;
	case SPVC_COMPILER_OPTION_FIXUP_DEPTH_CONVENTION:
		options->glsl.vertex.fixup_clipspace = value != 0;
		break;
	case SPVC_COMPILER_OPTION_FLIP_VERTEX_Y:
		options->glsl.vertex.flip_vert_y = value != 0;
		break;
	case SPVC_COMPILER_OPTION_EMIT_LINE_DIRECTIVES:
		options->glsl.emit_line_directives = value != 0;
		break;
	case SPVC_COMPILER_OPTION_ENABLE_STORAGE_IMAGE_QUALIFIER_DEDUCTION:
		options->glsl.enable_storage_image_qualifier_deduction = value != 0;
		break;
	case SPVC_COMPILER_OPTION_FORCE_ZERO_INITIALIZED_VARIABLES:
		options->glsl.force_zero_initialized_variables = value != 0;
		break;

	case SPVC_COMPILER_OPTION_GLSL_SUPPORT_NONZERO_BASE_INSTANCE:
		options->glsl.vertex.support_nonzero_base_instance = value != 0;
		break;
	case SPVC_COMPILER_OPTION_GLSL_SEPARATE_SHADER_OBJECTS:
		options->glsl.separate_shader_objects = value != 0;
		break;
	case SPVC_COMPILER_OPTION_GLSL_ENABLE_420PACK_EXTENSION:
		options->glsl.enable_420pack_extension = value != 0;
		break;
	case SPVC_COMPILER_OPTION_GLSL_VERSION:
		options->glsl.version = value;
		break;
	case SPVC_COMPILER_OPTION_GLSL_ES:
		options->glsl.es = value != 0;
		break;
	case SPVC_COMPILER_OPTION_GLSL_VULKAN_SEMANTICS:
		options->glsl.vulkan_semantics = value != 0;
		break;
	case SPVC_COMPILER_OPTION_GLSL_ES_DEFAULT_FLOAT_PRECISION_HIGHP:
		options->glsl.fragment.default_float_precision =
		    value != 0 ? CompilerGLSL::Options::Precision::Highp : CompilerGLSL::Options::Precision::Mediump;
		break;
	case SPVC_COMPILER_OPTION_GLSL_ES_DEFAULT_INT_PRECISION_HIGHP:
		options->glsl.fragment.default_int_precision =
		    value != 0 ? CompilerGLSL::Options::Precision::Highp : CompilerGLSL::Options::Precision::Mediump;
		break;
	case SPVC_COMPILER_OPTION_GLSL_EMIT_PUSH_CONSTANT_AS_UNIFORM_BUFFER:
		options->glsl.emit_push_constant_as_uniform_buffer = value != 0;
		break;
	case SPVC_COMPILER_OPTION_GLSL_EMIT_UNIFORM_BUFFER_AS_PLAIN_UNIFORMS:
		options->glsl.emit_uniform_buffer_as_plain_uniforms = value != 0;
		break;
	case SPVC_COMPILER_OPTION_GLSL_FORCE_FLATTENED_IO_BLOCKS:
		options->glsl.force_flattened_io_blocks = value != 0;
		break;
	case SPVC_COMPILER_OPTION_GLSL_OVR_MULTIVIEW_VIEW_COUNT:
		options->glsl.ovr_multiview_view_count = value;
		break;
	case SPVC_COMPILER_OPTION_RELAX_NAN_CHECKS:
		options->glsl.relax_nan_checks = value != 0;
		break;
	case SPVC_COMPILER_OPTION_GLSL_ENABLE_ROW_MAJOR_LOAD_WORKAROUND:
		options->glsl.enable_row_major_load_workaround = value != 0;
		break;
#endif

#if SPIRV_CROSS_C_API_HLSL
	case SPVC_COMPILER_OPTION_HLSL_SHADER_MODEL:
		options->hlsl.shader_model = value;
		break;

	case SPVC_COMPILER_OPTION_HLSL_POINT_SIZE_COMPAT:
		options->hlsl.point_size_compat = value != 0;
		break;

	case SPVC_COMPILER_OPTION_HLSL_POINT_COORD_COMPAT:
		options->hlsl.point_coord_compat = value != 0;
		break;

	case SPVC_COMPILER_OPTION_HLSL_SUPPORT_NONZERO_BASE_VERTEX_BASE_INSTANCE:
		options->hlsl.support_nonzero_base_vertex_base_instance = value != 0;
		break;

	case SPVC_COMPILER_OPTION_HLSL_FORCE_STORAGE_BUFFER_AS_UAV:
		options->hlsl.force_storage_buffer_as_uav = value != 0;
		break;

	case SPVC_COMPILER_OPTION_HLSL_NONWRITABLE_UAV_TEXTURE_AS_SRV:
		options->hlsl.nonwritable_uav_texture_as_srv = value != 0;
		break;

	case SPVC_COMPILER_OPTION_HLSL_ENABLE_16BIT_TYPES:
		options->hlsl.enable_16bit_types = value != 0;
		break;

	case SPVC_COMPILER_OPTION_HLSL_FLATTEN_MATRIX_VERTEX_INPUT_SEMANTICS:
		options->hlsl.flatten_matrix_vertex_input_semantics = value != 0;
		break;

	case SPVC_COMPILER_OPTION_HLSL_USE_ENTRY_POINT_NAME:
		options->hlsl.use_entry_point_name = value != 0;
		break;

	case SPVC_COMPILER_OPTION_HLSL_PRESERVE_STRUCTURED_BUFFERS:
		options->hlsl.preserve_structured_buffers = value != 0;
		break;
#endif

#if SPIRV_CROSS_C_API_MSL
	case SPVC_COMPILER_OPTION_MSL_VERSION:
		options->msl.msl_version = value;
		break;

	case SPVC_COMPILER_OPTION_MSL_TEXEL_BUFFER_TEXTURE_WIDTH:
		options->msl.texel_buffer_texture_width = value;
		break;

	case SPVC_COMPILER_OPTION_MSL_SWIZZLE_BUFFER_INDEX:
		options->msl.swizzle_buffer_index = value;
		break;

	case SPVC_COMPILER_OPTION_MSL_INDIRECT_PARAMS_BUFFER_INDEX:
		options->msl.indirect_params_buffer_index = value;
		break;

	case SPVC_COMPILER_OPTION_MSL_SHADER_OUTPUT_BUFFER_INDEX:
		options->msl.shader_output_buffer_index = value;
		break;

	case SPVC_COMPILER_OPTION_MSL_SHADER_PATCH_OUTPUT_BUFFER_INDEX:
		options->msl.shader_patch_output_buffer_index = value;
		break;

	case SPVC_COMPILER_OPTION_MSL_SHADER_TESS_FACTOR_OUTPUT_BUFFER_INDEX:
		options->msl.shader_tess_factor_buffer_index = value;
		break;

	case SPVC_COMPILER_OPTION_MSL_SHADER_INPUT_WORKGROUP_INDEX:
		options->msl.shader_input_wg_index = value;
		break;

	case SPVC_COMPILER_OPTION_MSL_ENABLE_POINT_SIZE_BUILTIN:
		options->msl.enable_point_size_builtin = value != 0;
		break;

	case SPVC_COMPILER_OPTION_MSL_DISABLE_RASTERIZATION:
		options->msl.disable_rasterization = value != 0;
		break;

	case SPVC_COMPILER_OPTION_MSL_CAPTURE_OUTPUT_TO_BUFFER:
		options->msl.capture_output_to_buffer = value != 0;
		break;

	case SPVC_COMPILER_OPTION_MSL_SWIZZLE_TEXTURE_SAMPLES:
		options->msl.swizzle_texture_samples = value != 0;
		break;

	case SPVC_COMPILER_OPTION_MSL_PAD_FRAGMENT_OUTPUT_COMPONENTS:
		options->msl.pad_fragment_output_components = value != 0;
		break;

	case SPVC_COMPILER_OPTION_MSL_TESS_DOMAIN_ORIGIN_LOWER_LEFT:
		options->msl.tess_domain_origin_lower_left = value != 0;
		break;

	case SPVC_COMPILER_OPTION_MSL_PLATFORM:
		options->msl.platform = static_cast<CompilerMSL::Options::Platform>(value);
		break;

	case SPVC_COMPILER_OPTION_MSL_ARGUMENT_BUFFERS:
		options->msl.argument_buffers = value != 0;
		break;

	case SPVC_COMPILER_OPTION_MSL_TEXTURE_BUFFER_NATIVE:
		options->msl.texture_buffer_native = value != 0;
		break;

	case SPVC_COMPILER_OPTION_MSL_BUFFER_SIZE_BUFFER_INDEX:
		options->msl.buffer_size_buffer_index = value;
		break;

	case SPVC_COMPILER_OPTION_MSL_MULTIVIEW:
		options->msl.multiview = value != 0;
		break;

	case SPVC_COMPILER_OPTION_MSL_VIEW_MASK_BUFFER_INDEX:
		options->msl.view_mask_buffer_index = value;
		break;

	case SPVC_COMPILER_OPTION_MSL_DEVICE_INDEX:
		options->msl.device_index = value;
		break;

	case SPVC_COMPILER_OPTION_MSL_VIEW_INDEX_FROM_DEVICE_INDEX:
		options->msl.view_index_from_device_index = value != 0;
		break;

	case SPVC_COMPILER_OPTION_MSL_DISPATCH_BASE:
		options->msl.dispatch_base = value != 0;
		break;

	case SPVC_COMPILER_OPTION_MSL_DYNAMIC_OFFSETS_BUFFER_INDEX:
		options->msl.dynamic_offsets_buffer_index = value;
		break;

	case SPVC_COMPILER_OPTION_MSL_TEXTURE_1D_AS_2D:
		options->msl.texture_1D_as_2D = value != 0;
		break;

	case SPVC_COMPILER_OPTION_MSL_ENABLE_BASE_INDEX_ZERO:
		options->msl.enable_base_index_zero = value != 0;
		break;

	case SPVC_COMPILER_OPTION_MSL_FRAMEBUFFER_FETCH_SUBPASS:
		options->msl.use_framebuffer_fetch_subpasses = value != 0;
		break;

	case SPVC_COMPILER_OPTION_MSL_INVARIANT_FP_MATH:
		options->msl.invariant_float_math = value != 0;
		break;

	case SPVC_COMPILER_OPTION_MSL_EMULATE_CUBEMAP_ARRAY:
		options->msl.emulate_cube_array = value != 0;
		break;

	case SPVC_COMPILER_OPTION_MSL_ENABLE_DECORATION_BINDING:
		options->msl.enable_decoration_binding = value != 0;
		break;

	case SPVC_COMPILER_OPTION_MSL_FORCE_ACTIVE_ARGUMENT_BUFFER_RESOURCES:
		options->msl.force_active_argument_buffer_resources = value != 0;
		break;

	case SPVC_COMPILER_OPTION_MSL_FORCE_NATIVE_ARRAYS:
		options->msl.force_native_arrays = value != 0;
		break;

	case SPVC_COMPILER_OPTION_MSL_ENABLE_FRAG_OUTPUT_MASK:
		options->msl.enable_frag_output_mask = value;
		break;

	case SPVC_COMPILER_OPTION_MSL_ENABLE_FRAG_DEPTH_BUILTIN:
		options->msl.enable_frag_depth_builtin = value != 0;
		break;

	case SPVC_COMPILER_OPTION_MSL_ENABLE_FRAG_STENCIL_REF_BUILTIN:
		options->msl.enable_frag_stencil_ref_builtin = value != 0;
		break;

	case SPVC_COMPILER_OPTION_MSL_ENABLE_CLIP_DISTANCE_USER_VARYING:
		options->msl.enable_clip_distance_user_varying = value != 0;
		break;

	case SPVC_COMPILER_OPTION_MSL_MULTI_PATCH_WORKGROUP:
		options->msl.multi_patch_workgroup = value != 0;
		break;

	case SPVC_COMPILER_OPTION_MSL_SHADER_INPUT_BUFFER_INDEX:
		options->msl.shader_input_buffer_index = value;
		break;

	case SPVC_COMPILER_OPTION_MSL_SHADER_INDEX_BUFFER_INDEX:
		options->msl.shader_index_buffer_index = value;
		break;

	case SPVC_COMPILER_OPTION_MSL_VERTEX_FOR_TESSELLATION:
		options->msl.vertex_for_tessellation = value != 0;
		break;

	case SPVC_COMPILER_OPTION_MSL_VERTEX_INDEX_TYPE:
		options->msl.vertex_index_type = static_cast<CompilerMSL::Options::IndexType>(value);
		break;

	case SPVC_COMPILER_OPTION_MSL_MULTIVIEW_LAYERED_RENDERING:
		options->msl.multiview_layered_rendering = value != 0;
		break;

	case SPVC_COMPILER_OPTION_MSL_ARRAYED_SUBPASS_INPUT:
		options->msl.arrayed_subpass_input = value != 0;
		break;

	case SPVC_COMPILER_OPTION_MSL_R32UI_LINEAR_TEXTURE_ALIGNMENT:
		options->msl.r32ui_linear_texture_alignment = value;
		break;

	case SPVC_COMPILER_OPTION_MSL_R32UI_ALIGNMENT_CONSTANT_ID:
		options->msl.r32ui_alignment_constant_id = value;
		break;

	case SPVC_COMPILER_OPTION_MSL_IOS_USE_SIMDGROUP_FUNCTIONS:
		options->msl.ios_use_simdgroup_functions = value != 0;
		break;

	case SPVC_COMPILER_OPTION_MSL_EMULATE_SUBGROUPS:
		options->msl.emulate_subgroups = value != 0;
		break;

	case SPVC_COMPILER_OPTION_MSL_FIXED_SUBGROUP_SIZE:
		options->msl.fixed_subgroup_size = value;
		break;

	case SPVC_COMPILER_OPTION_MSL_FORCE_SAMPLE_RATE_SHADING:
		options->msl.force_sample_rate_shading = value != 0;
		break;

	case SPVC_COMPILER_OPTION_MSL_IOS_SUPPORT_BASE_VERTEX_INSTANCE:
		options->msl.ios_support_base_vertex_instance = value != 0;
		break;

	case SPVC_COMPILER_OPTION_MSL_RAW_BUFFER_TESE_INPUT:
		options->msl.raw_buffer_tese_input = value != 0;
		break;

	case SPVC_COMPILER_OPTION_MSL_SHADER_PATCH_INPUT_BUFFER_INDEX:
		options->msl.shader_patch_input_buffer_index = value;
		break;

	case SPVC_COMPILER_OPTION_MSL_MANUAL_HELPER_INVOCATION_UPDATES:
		options->msl.manual_helper_invocation_updates = value != 0;
		break;

	case SPVC_COMPILER_OPTION_MSL_CHECK_DISCARDED_FRAG_STORES:
		options->msl.check_discarded_frag_stores = value != 0;
		break;

	case SPVC_COMPILER_OPTION_MSL_ARGUMENT_BUFFERS_TIER:
		options->msl.argument_buffers_tier = static_cast<CompilerMSL::Options::ArgumentBuffersTier>(value);
		break;

	case SPVC_COMPILER_OPTION_MSL_SAMPLE_DREF_LOD_ARRAY_AS_GRAD:
		options->msl.sample_dref_lod_array_as_grad = value != 0;
		break;

	case SPVC_COMPILER_OPTION_MSL_READWRITE_TEXTURE_FENCES:
		options->msl.readwrite_texture_fences = value != 0;
		break;

	case SPVC_COMPILER_OPTION_MSL_REPLACE_RECURSIVE_INPUTS:
		options->msl.replace_recursive_inputs = value != 0;
		break;

	case SPVC_COMPILER_OPTION_MSL_AGX_MANUAL_CUBE_GRAD_FIXUP:
		options->msl.agx_manual_cube_grad_fixup = value != 0;
		break;

	case SPVC_COMPILER_OPTION_MSL_FORCE_FRAGMENT_WITH_SIDE_EFFECTS_EXECUTION:
		options->msl.force_fragment_with_side_effects_execution = value != 0;
		break;
#endif

	default:
		options->context->report_error("Unknown option.");
		return SPVC_ERROR_INVALID_ARGUMENT;
	}

	return SPVC_SUCCESS;
}